

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSampleWrapC.cpp
# Opt level: O1

void tsgDreamSample(int form,int num_burnup,int num_collect,tsg_dream_pdf distribution,
                   void *state_pntr,void *domain_grid,double *domain_lower,double *dommain_upper,
                   tsg_dream_domain domain_callback,char *iupdate_type,double iupdate_magnitude,
                   tsg_dream_iupdate iupdate_callback,int dupdate_percent,
                   tsg_dream_dupdate dupdate_callback,char *random_type,int random_seed,
                   tsg_dream_random random_callback,int *err)

{
  TypeDistribution dist;
  function<double_()> differential_update;
  function<double_()> differential_update_00;
  function<double_()> get_random01;
  function<double_()> get_random01_00;
  char *__s;
  uint __seed;
  int iVar1;
  mapped_type *pmVar2;
  code *pcVar4;
  ulong uVar5;
  undefined8 uStack_348;
  int num_dimensions;
  undefined8 uVar6;
  undefined8 uVar7;
  code *pcVar8;
  tsg_dream_pdf distribution_local;
  string rtype;
  _Any_data local_2e8;
  code *local_2d8;
  code *pcStack_2d0;
  double local_2b0;
  _Any_data local_2a8;
  code *local_298;
  code *pcStack_290;
  _Any_data local_288;
  code *local_278;
  code *pcStack_270;
  _Any_data local_268;
  code *local_258;
  code *pcStack_250;
  _Any_data local_248;
  code *local_238;
  code *pcStack_230;
  _Any_data local_228;
  code *local_218;
  code *pcStack_210;
  _Any_data local_208;
  code *local_1f8;
  code *pcStack_1f0;
  function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> domain;
  minstd_rand park_miller;
  _Any_data local_1c0;
  code *local_1b0;
  _Any_data local_1a0;
  code *local_190;
  _Any_data local_180;
  code *local_170;
  _Any_data local_160;
  code *local_150;
  uniform_real_distribution<double> unif;
  _Any_data local_130;
  code *local_120;
  _Any_data local_110;
  code *local_100;
  _Any_data local_f0;
  code *local_e0;
  _Any_data local_d0;
  code *local_c0;
  _Any_data local_b0;
  code *local_a0;
  _Any_data local_90;
  code *local_80;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  time_t tVar3;
  
  *err = 1;
  num_dimensions = *(int *)((long)state_pntr + 8);
  distribution_local = distribution;
  local_2b0 = iupdate_magnitude;
  TasDREAM::getSpecifiedDomain
            (&domain,num_dimensions,domain_grid,domain_lower,dommain_upper,domain_callback);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rtype,iupdate_type,(allocator<char> *)&stack0xfffffffffffffcc8);
  TasDREAM::IO::getStringRuleMap_abi_cxx11_();
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>_>
                 *)&local_2e8,&rtype);
  dist = *pmVar2;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>_>
               *)&local_2e8);
  local_2e8._0_4_ = dupdate_percent;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rtype._M_dataplus._M_p != &rtype.field_2) {
    operator_delete(rtype._M_dataplus._M_p,rtype.field_2._M_allocated_capacity + 1);
  }
  __seed = random_seed;
  local_2e8._8_8_ = 0;
  if ((int)local_2e8._0_4_ < 0) {
    local_2e8._M_unused._M_function_pointer = (_func_void *)dupdate_callback;
    local_2d8 = std::
                _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:64:16)>
                ::_M_manager;
    pcStack_2d0 = std::
                  _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:64:16)>
                  ::_M_invoke;
  }
  else {
    local_2e8._4_4_ = 0;
    local_2d8 = std::
                _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:62:16)>
                ::_M_manager;
    pcStack_2d0 = std::
                  _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:62:16)>
                  ::_M_invoke;
  }
  if (random_seed == -1) {
    uVar5 = time((time_t *)0x0);
  }
  else {
    uVar5 = (ulong)random_seed;
  }
  __s = random_type;
  park_miller._M_x = uVar5 % 0x7fffffff + (ulong)(uVar5 % 0x7fffffff == 0);
  unif._M_param._M_a = 0.0;
  unif._M_param._M_b = 1.0;
  if (__seed == -1) {
    tVar3 = time((time_t *)0x0);
    __seed = (uint)tVar3;
  }
  srand(__seed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rtype,__s,(allocator<char> *)&stack0xfffffffffffffcc8);
  iVar1 = std::__cxx11::string::compare((char *)&rtype);
  if (iVar1 == 0) {
    uVar6 = (uniform_real_distribution<double> *)0x0;
    uVar7 = (minstd_rand *)0x0;
    pcVar8 = std::
             _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:148:20)>
             ::_M_invoke;
    pcVar4 = std::
             _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:148:20)>
             ::_M_manager;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&rtype);
    uVar7 = (minstd_rand *)0x0;
    if (iVar1 == 0) {
      uVar6 = &unif;
      uVar7 = &park_miller;
      pcVar8 = std::
               _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:150:20)>
               ::_M_invoke;
      pcVar4 = std::
               _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:150:20)>
               ::_M_manager;
    }
    else {
      uVar6 = &random_callback;
      pcVar8 = std::
               _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:152:20)>
               ::_M_invoke;
      pcVar4 = std::
               _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:152:20)>
               ::_M_manager;
    }
  }
  if (dist == dist_null) {
    if (form == 0) {
      local_248._M_unused._M_object = &num_dimensions;
      local_248._8_8_ = &distribution_local;
      pcStack_230 = std::
                    _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:159:63)>
                    ::_M_invoke;
      local_238 = std::
                  _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:159:63)>
                  ::_M_manager;
      std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::function
                ((function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> *)&local_160
                 ,&domain);
      local_208._8_8_ = 0;
      local_208._M_unused._M_object = &iupdate_callback;
      pcStack_1f0 = std::
                    _Function_handler<void_(std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:165:35)>
                    ::_M_invoke;
      local_1f8 = std::
                  _Function_handler<void_(std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:165:35)>
                  ::_M_manager;
      std::function<double_()>::function
                ((function<double_()> *)&local_50,(function<double_()> *)&local_2e8);
      std::function<double_()>::function
                ((function<double_()> *)&local_70,(function<double_()> *)&stack0xfffffffffffffcc8);
      TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)0>
                (num_burnup,num_collect,(DreamPDF *)&local_248,(DreamDomain *)&local_160,
                 (TasmanianDREAM *)state_pntr,
                 (function<void_(std::vector<double,_std::allocator<double>_>_&)> *)&local_208,
                 (function<double_()> *)&local_50,(function<double_()> *)&local_70);
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,__destroy_functor);
      }
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      if (local_1f8 != (code *)0x0) {
        (*local_1f8)(&local_208,&local_208,__destroy_functor);
      }
      if (local_150 != (code *)0x0) {
        (*local_150)(&local_160,&local_160,__destroy_functor);
      }
      if (local_238 != (code *)0x0) {
        (*local_238)(&local_248,&local_248,__destroy_functor);
      }
    }
    else {
      local_268._M_unused._M_object = &num_dimensions;
      local_268._8_8_ = &distribution_local;
      pcStack_250 = std::
                    _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:172:63)>
                    ::_M_invoke;
      local_258 = std::
                  _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:172:63)>
                  ::_M_manager;
      std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::function
                ((function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> *)&local_180
                 ,&domain);
      local_228._8_8_ = 0;
      local_228._M_unused._M_object = &iupdate_callback;
      pcStack_210 = std::
                    _Function_handler<void_(std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:178:35)>
                    ::_M_invoke;
      local_218 = std::
                  _Function_handler<void_(std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:178:35)>
                  ::_M_manager;
      std::function<double_()>::function
                ((function<double_()> *)&local_90,(function<double_()> *)&local_2e8);
      std::function<double_()>::function
                ((function<double_()> *)&local_b0,(function<double_()> *)&stack0xfffffffffffffcc8);
      TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)1>
                (num_burnup,num_collect,(DreamPDF *)&local_268,(DreamDomain *)&local_180,
                 (TasmanianDREAM *)state_pntr,
                 (function<void_(std::vector<double,_std::allocator<double>_>_&)> *)&local_228,
                 (function<double_()> *)&local_90,(function<double_()> *)&local_b0);
      if (local_a0 != (code *)0x0) {
        (*local_a0)(&local_b0,&local_b0,__destroy_functor);
      }
      if (local_80 != (code *)0x0) {
        (*local_80)(&local_90,&local_90,__destroy_functor);
      }
      if (local_218 != (code *)0x0) {
        (*local_218)(&local_228,&local_228,__destroy_functor);
      }
      if (local_170 != (code *)0x0) {
        (*local_170)(&local_180,&local_180,__destroy_functor);
      }
      if (local_258 != (code *)0x0) {
        (*local_258)(&local_268,&local_268,__destroy_functor);
      }
    }
  }
  else if (form == 0) {
    local_288._8_8_ = &distribution_local;
    pcStack_270 = std::
                  _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:187:63)>
                  ::_M_invoke;
    local_278 = std::
                _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:187:63)>
                ::_M_manager;
    local_288._M_unused._M_object = &num_dimensions;
    std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::function
              ((function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> *)&local_1a0,
               &domain);
    std::function<double_()>::function
              ((function<double_()> *)&local_d0,(function<double_()> *)&local_2e8);
    std::function<double_()>::function
              ((function<double_()> *)&local_f0,(function<double_()> *)&stack0xfffffffffffffcc8);
    differential_update_00.super__Function_base._M_functor._8_8_ = &local_f0;
    differential_update_00.super__Function_base._M_functor._M_unused._M_object = &local_d0;
    differential_update_00.super__Function_base._M_manager = (_Manager_type)uStack_348;
    differential_update_00._M_invoker._0_4_ = num_collect;
    differential_update_00._M_invoker._4_4_ = num_dimensions;
    get_random01_00.super__Function_base._M_functor._8_8_ = uVar7;
    get_random01_00.super__Function_base._M_functor._M_unused._M_object = (void *)uVar6;
    get_random01_00.super__Function_base._M_manager = pcVar4;
    get_random01_00._M_invoker = pcVar8;
    TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)0>
              (num_burnup,num_collect,(DreamPDF *)&local_288,(DreamDomain *)&local_1a0,
               (TasmanianDREAM *)state_pntr,dist,local_2b0,differential_update_00,get_random01_00);
    if (local_e0 != (code *)0x0) {
      (*local_e0)(&local_f0,&local_f0,__destroy_functor);
    }
    if (local_c0 != (code *)0x0) {
      (*local_c0)(&local_d0,&local_d0,__destroy_functor);
    }
    if (local_190 != (code *)0x0) {
      (*local_190)(&local_1a0,&local_1a0,__destroy_functor);
    }
    if (local_278 != (code *)0x0) {
      (*local_278)(&local_288,&local_288,__destroy_functor);
    }
  }
  else {
    local_2a8._8_8_ = &distribution_local;
    pcStack_290 = std::
                  _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:195:63)>
                  ::_M_invoke;
    local_298 = std::
                _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:195:63)>
                ::_M_manager;
    local_2a8._M_unused._M_object = &num_dimensions;
    std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::function
              ((function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> *)&local_1c0,
               &domain);
    std::function<double_()>::function
              ((function<double_()> *)&local_110,(function<double_()> *)&local_2e8);
    std::function<double_()>::function
              ((function<double_()> *)&local_130,(function<double_()> *)&stack0xfffffffffffffcc8);
    differential_update.super__Function_base._M_functor._8_8_ = &local_130;
    differential_update.super__Function_base._M_functor._M_unused._M_object = &local_110;
    differential_update.super__Function_base._M_manager = (_Manager_type)uStack_348;
    differential_update._M_invoker._0_4_ = num_collect;
    differential_update._M_invoker._4_4_ = num_dimensions;
    get_random01.super__Function_base._M_functor._8_8_ = uVar7;
    get_random01.super__Function_base._M_functor._M_unused._M_object = (void *)uVar6;
    get_random01.super__Function_base._M_manager = pcVar4;
    get_random01._M_invoker = pcVar8;
    TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)1>
              (num_burnup,num_collect,(DreamPDF *)&local_2a8,(DreamDomain *)&local_1c0,
               (TasmanianDREAM *)state_pntr,dist,local_2b0,differential_update,get_random01);
    if (local_120 != (code *)0x0) {
      (*local_120)(&local_130,&local_130,__destroy_functor);
    }
    if (local_100 != (code *)0x0) {
      (*local_100)(&local_110,&local_110,__destroy_functor);
    }
    if (local_1b0 != (code *)0x0) {
      (*local_1b0)(&local_1c0,&local_1c0,__destroy_functor);
    }
    if (local_298 != (code *)0x0) {
      (*local_298)(&local_2a8,&local_2a8,__destroy_functor);
    }
  }
  *err = 0;
  if (pcVar4 != (_Manager_type)0x0) {
    (*pcVar4)((_Any_data *)&stack0xfffffffffffffcc8,(_Any_data *)&stack0xfffffffffffffcc8,
              __destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rtype._M_dataplus._M_p != &rtype.field_2) {
    operator_delete(rtype._M_dataplus._M_p,rtype.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8 != (code *)0x0) {
    (*local_2d8)(&local_2e8,&local_2e8,3);
  }
  if (domain.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*domain.super__Function_base._M_manager)
              ((_Any_data *)&domain,(_Any_data *)&domain,__destroy_functor);
  }
  return;
}

Assistant:

void tsgDreamSample(int form,
                    int num_burnup, int num_collect,
                    tsg_dream_pdf distribution,
                    void* state_pntr,
                    void *domain_grid, double domain_lower[], double dommain_upper[], tsg_dream_domain domain_callback,
                    const char* iupdate_type, double iupdate_magnitude, tsg_dream_iupdate iupdate_callback,
                    int dupdate_percent, tsg_dream_dupdate dupdate_callback,
                    const char* random_type, int random_seed, tsg_dream_random random_callback, int *err){
    *err = 1;
    TasmanianDREAM& state = *reinterpret_cast<TasmanianDREAM*>(state_pntr);

    int num_dimensions = (int) state.getNumDimensions();

    auto domain = getSpecifiedDomain(num_dimensions, domain_grid, domain_lower, dommain_upper, domain_callback);

    TypeDistribution dist = IO::getDistributionString(iupdate_type);

    auto diff_update = getSpecifiedDifferentialUpdate(dupdate_percent, dupdate_callback);

    std::minstd_rand park_miller((random_seed == -1) ? static_cast<long unsigned>(std::time(nullptr)) : random_seed);
    std::uniform_real_distribution<double> unif(0.0, 1.0);
    srand((unsigned int) ((random_seed == -1) ? static_cast<long unsigned>(std::time(nullptr)) : random_seed));
    std::string rtype(random_type);

    auto randgen = [&]()->
    std::function<double(void)>{
        if (rtype == "default"){
            return [&]()->double{ return tsgCoreUniform01(); };
        }else if (rtype == "minstd_rand"){
            return [&]()->double{ return unif(park_miller); };
        }else{
            return [&]()->double{ return random_callback(); };
        }
    }();

    try{
        if (dist == dist_null){
            if (IO::intToForm(form) == regform){
                SampleDREAM<regform>(num_burnup, num_collect, [&](const std::vector<double> &candidates, std::vector<double> &values)->
                void{
                    int num_samples = (int) candidates.size() / num_dimensions;
                    int error_code = 0;
                    distribution(num_samples, num_dimensions, candidates.data(), values.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in tsgDreamSample()");
                }, domain, state, [&](std::vector<double> &x)->
                void{
                    int error_code = 0;
                    iupdate_callback((int) x.size(), x.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in tsgDreamSample()");
                }, diff_update, randgen);
            }else{
                SampleDREAM<logform>(num_burnup, num_collect, [&](const std::vector<double> &candidates, std::vector<double> &values)->
                void{
                    int num_samples = (int) candidates.size() / num_dimensions;
                    int error_code = 0;
                    distribution(num_samples, num_dimensions, candidates.data(), values.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in tsgDreamSample()");
                }, domain, state, [&](std::vector<double> &x)->
                void{
                    int error_code = 0;
                    iupdate_callback((int) x.size(), x.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in tsgDreamSample()");
                }, diff_update, randgen);
            }
        }else{
            if (IO::intToForm(form) == regform){
                SampleDREAM<regform>(num_burnup, num_collect, [&](const std::vector<double> &candidates, std::vector<double> &values)->
                void{
                    int num_samples = (int) candidates.size() / num_dimensions;
                    int error_code = 0;
                    distribution(num_samples, num_dimensions, candidates.data(), values.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in tsgDreamSample()");
                }, domain, state, dist, iupdate_magnitude, diff_update, randgen);
            }else{
                SampleDREAM<logform>(num_burnup, num_collect, [&](const std::vector<double> &candidates, std::vector<double> &values)->
                void{
                    int num_samples = (int) candidates.size() / num_dimensions;
                    int error_code = 0;
                    distribution(num_samples, num_dimensions, candidates.data(), values.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in analysis()");
                }, domain, state, dist, iupdate_magnitude, diff_update, randgen);
            }
        }
        *err = 0; // success
    }catch(std::runtime_error &){} // *err will remain 1
}